

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O1

void __thiscall
WordSplitStringTest_random_long_prefix_delim_Test<unsigned_char>::TestBody
          (WordSplitStringTest_random_long_prefix_delim_Test<unsigned_char> *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> delim
  ;
  vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  split_result;
  RandomWordTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  data;
  long *local_110;
  AssertHelper local_108 [8];
  internal local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_f0;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_d0;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_b0;
  RandomWordTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  local_90;
  
  make_delim_long<unsigned_char,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_f0,8,'\0');
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::
  basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>::
  _M_construct<unsigned_char*>
            ((basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>
              *)&local_d0,local_f0._M_dataplus._M_p,
             local_f0._M_dataplus._M_p + local_f0._M_string_length);
  RandomWordTestData<unsigned_char,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
  ::RandomWordTestData(&local_90,&local_d0,0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_b0,&local_f0,&local_90.m_str);
  TestBody();
  jessilib::
  word_split<std::vector,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
            ((container_type *)&local_b0,
             (__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
              )local_90.m_str._M_dataplus._M_p,
             (__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
              )(local_90.m_str._M_dataplus._M_p + local_90.m_str._M_string_length),
             (__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
              )local_f0._M_dataplus._M_p,
             (__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
              )(local_f0._M_dataplus._M_p + local_f0._M_string_length));
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::allocator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>,std::vector<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::allocator<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>>
            (local_100,"split_result","data.m_tokens",
             (vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
              *)&local_b0,&local_90.m_tokens);
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (local_f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_f8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x107,pcVar1);
    testing::internal::AssertHelper::operator=(local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(local_108);
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
  }
  if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f8,local_f8);
  }
  std::
  vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
             *)&local_b0);
  if (local_90.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.m_token_indexes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_90.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_90.m_str._M_dataplus._M_p != &local_90.m_str.field_2) {
    operator_delete(local_90.m_str._M_dataplus._M_p,local_90.m_str.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_90.m_delim._M_dataplus._M_p != &local_90.m_delim.field_2) {
    operator_delete(local_90.m_delim._M_dataplus._M_p,
                    local_90.m_delim.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitStringTest, random_long_prefix_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomWordTestData<TypeParam> data{ delim };
	data.m_str = delim + data.m_str;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}